

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adynarray.c
# Opt level: O0

void test_ADynArray_appendArray_failure_nullptrDestArray_fn(int _i)

{
  bool bVar1;
  uintmax_t _ck_y_1;
  uintmax_t _ck_x_1;
  uintmax_t _ck_y;
  uintmax_t _ck_x;
  private_ACUtilsTest_ADynArray_CharArray *arrayPtr;
  int _i_local;
  
  private_ACUtilsTest_ADynArray_reallocFail = false;
  private_ACUtilsTest_ADynArray_reallocCount = 0;
  bVar1 = private_ACUtils_ADynArray_insertArray((void *)0x0,0,"012",3,1);
  if ((ulong)bVar1 != 0) {
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                      ,0x592,"Assertion \'_ck_x == _ck_y\' failed",
                      "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                      "private_ACUtils_ADynArray_insertArray(arrayPtr, 0, \"012\", 3, sizeof(*(arrayPtr)->buffer)) == false"
                      ,
                      "private_ACUtils_ADynArray_insertArray(arrayPtr, 0, \"012\", 3, sizeof(*(arrayPtr)->buffer))"
                      ,(ulong)bVar1,"false",0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
              ,0x592);
  if (private_ACUtilsTest_ADynArray_reallocCount == 0) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                ,0x593);
    return;
  }
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_adynarray.c"
                    ,0x593,"Assertion \'_ck_x == _ck_y\' failed",
                    "Assertion \'%s\' failed: %s == %ju, %s == %ju",
                    "private_ACUtilsTest_ADynArray_reallocCount == 0",
                    "private_ACUtilsTest_ADynArray_reallocCount",
                    private_ACUtilsTest_ADynArray_reallocCount,"0",0,0);
}

Assistant:

END_TEST
START_TEST(test_ADynArray_appendArray_failure_nullptrDestArray)
{
    struct private_ACUtilsTest_ADynArray_CharArray *arrayPtr = nullptr;
    private_ACUtilsTest_ADynArray_reallocFail = false;
    private_ACUtilsTest_ADynArray_reallocCount = 0;
    ACUTILSTEST_ASSERT_UINT_EQ(ADynArray_insertArray(arrayPtr, 0, "012", 3), false);
    ACUTILSTEST_ASSERT_UINT_EQ(private_ACUtilsTest_ADynArray_reallocCount, 0);
}